

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasKrylovDemo_ls.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  void *mem_00;
  undefined8 uVar7;
  undefined8 *__ptr;
  undefined8 uVar8;
  long in_RSI;
  int in_EDI;
  SUNContext ctx;
  sunrealtype nrmfac;
  int nrmfactor;
  SUNLinearSolver LS;
  long ncfl;
  long ncfn;
  long netf;
  sunrealtype tret;
  sunrealtype tout;
  sunrealtype t1;
  sunrealtype t0;
  sunrealtype atol;
  sunrealtype rtol;
  int linsolver;
  int iout;
  int retval;
  N_Vector res;
  N_Vector constraints;
  N_Vector up;
  N_Vector uu;
  UserData data;
  void *mem;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  void *in_stack_ffffffffffffff48;
  double rtol_00;
  int local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 local_80 [8];
  N_Vector in_stack_ffffffffffffff88;
  N_Vector in_stack_ffffffffffffff90;
  N_Vector up_00;
  N_Vector in_stack_ffffffffffffff98;
  N_Vector uu_00;
  UserData in_stack_ffffffffffffffa0;
  UserData data_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 local_18 [2];
  int local_4;
  
  local_4 = 0;
  local_18[0] = 0;
  local_a0 = 0;
  local_a4 = 0;
  if (1 < in_EDI) {
    local_a4 = atoi(*(char **)(in_RSI + 8));
  }
  SUNContext_Create(0,&stack0xffffffffffffff48);
  iVar1 = check_retval(in_stack_ffffffffffffff48,
                       (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
  if (iVar1 == 0) {
    uVar5 = N_VNew_Serial(100,in_stack_ffffffffffffff48);
    iVar1 = check_retval(in_stack_ffffffffffffff48,
                         (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
    if (iVar1 == 0) {
      uVar6 = N_VClone(uVar5);
      iVar1 = check_retval(in_stack_ffffffffffffff48,
                           (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff3c);
      if (iVar1 == 0) {
        mem_00 = (void *)N_VClone(uVar5);
        iVar1 = check_retval(in_stack_ffffffffffffff48,
                             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             in_stack_ffffffffffffff3c);
        if (iVar1 == 0) {
          uVar7 = N_VClone(uVar5);
          iVar1 = check_retval(in_stack_ffffffffffffff48,
                               (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                               ,in_stack_ffffffffffffff3c);
          if (iVar1 == 0) {
            __ptr = (undefined8 *)malloc(0x20);
            __ptr[3] = 0;
            iVar1 = check_retval(in_stack_ffffffffffffff48,
                                 (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                  in_stack_ffffffffffffff40),
                                 in_stack_ffffffffffffff3c);
            if (iVar1 == 0) {
              *__ptr = 10;
              __ptr[1] = 0x3fbc71c71c71c71c;
              __ptr[2] = 1.0 / ((double)__ptr[1] * (double)__ptr[1]);
              uVar8 = N_VClone(uVar5);
              __ptr[3] = uVar8;
              iVar1 = check_retval(in_stack_ffffffffffffff48,
                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                    in_stack_ffffffffffffff40),
                                   in_stack_ffffffffffffff3c);
              if (iVar1 == 0) {
                SetInitialProfile(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                  in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
                N_VConst(0x3ff0000000000000,uVar7);
                uu_00 = (N_Vector)0x0;
                up_00 = (N_Vector)&DAT_3f847ae147ae147b;
                uVar8 = 0;
                data_00 = (UserData)&DAT_3f50624dd2f1a9fc;
                local_18[0] = IDACreate(in_stack_ffffffffffffff48);
                iVar1 = check_retval(in_stack_ffffffffffffff48,
                                     (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                      in_stack_ffffffffffffff40),
                                     in_stack_ffffffffffffff3c);
                if (iVar1 == 0) {
                  IDASetUserData(local_18[0],__ptr);
                  iVar1 = check_retval(in_stack_ffffffffffffff48,
                                       (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                        in_stack_ffffffffffffff40),
                                       in_stack_ffffffffffffff3c);
                  if (iVar1 == 0) {
                    IDASetConstraints(local_18[0],uVar7);
                    iVar1 = check_retval(in_stack_ffffffffffffff48,
                                         (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                          in_stack_ffffffffffffff40),
                                         in_stack_ffffffffffffff3c);
                    if (iVar1 == 0) {
                      N_VDestroy(uVar7);
                      IDAInit(uu_00,local_18[0],resHeat,uVar5,uVar6);
                      iVar1 = check_retval(in_stack_ffffffffffffff48,
                                           (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                            in_stack_ffffffffffffff40),
                                           in_stack_ffffffffffffff3c);
                      if (iVar1 == 0) {
                        IDASStolerances(uVar8,data_00,local_18[0]);
                        iVar1 = check_retval(in_stack_ffffffffffffff48,
                                             (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                              in_stack_ffffffffffffff40),
                                             in_stack_ffffffffffffff3c);
                        if (iVar1 == 0) {
                          for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
                            if (iVar1 != 0) {
                              SetInitialProfile(data_00,uu_00,up_00,in_stack_ffffffffffffff88);
                              IDAReInit(uu_00,local_18[0],uVar5,uVar6);
                              iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                    in_stack_ffffffffffffff40),
                                                   in_stack_ffffffffffffff3c);
                              if (iVar2 != 0) {
                                return 1;
                              }
                            }
                            in_stack_ffffffffffffff44 = iVar1;
                            in_stack_ffffffffffffff88 = up_00;
                            SUNLinSolFree(local_a0);
                            iVar1 = in_stack_ffffffffffffff44;
                            if (in_stack_ffffffffffffff44 == 0) {
                              printf(" -------");
                              printf(" \n| SPGMR |\n");
                              printf(" -------\n");
                              local_a0 = SUNLinSol_SPGMR(uVar5,1,0,in_stack_ffffffffffffff48);
                              iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                    in_stack_ffffffffffffff40),
                                                   in_stack_ffffffffffffff3c);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              IDASetLinearSolver(local_18[0],local_a0,0);
                              iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                    in_stack_ffffffffffffff40),
                                                   in_stack_ffffffffffffff3c);
                              if (iVar2 != 0) {
                                return 1;
                              }
                            }
                            else if (in_stack_ffffffffffffff44 == 1) {
                              printf(" -------");
                              printf(" \n| SPBCGS |\n");
                              printf(" -------\n");
                              local_a0 = SUNLinSol_SPBCGS(uVar5,1,0,in_stack_ffffffffffffff48);
                              iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                    in_stack_ffffffffffffff40),
                                                   in_stack_ffffffffffffff3c);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              IDASetLinearSolver(local_18[0],local_a0,0);
                              iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                    in_stack_ffffffffffffff40),
                                                   in_stack_ffffffffffffff3c);
                              if (iVar2 != 0) {
                                return 1;
                              }
                            }
                            else if (in_stack_ffffffffffffff44 == 2) {
                              printf(" ---------");
                              printf(" \n| SPTFQMR |\n");
                              printf(" ---------\n");
                              local_a0 = SUNLinSol_SPTFQMR(uVar5,1,0,in_stack_ffffffffffffff48);
                              iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                    in_stack_ffffffffffffff40),
                                                   in_stack_ffffffffffffff3c);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              IDASetLinearSolver(local_18[0],local_a0,0);
                              iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                    in_stack_ffffffffffffff40),
                                                   in_stack_ffffffffffffff3c);
                              if (iVar2 != 0) {
                                return 1;
                              }
                            }
                            IDASetPreconditioner(local_18[0],PsetupHeat,PsolveHeat);
                            iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                  in_stack_ffffffffffffff40),
                                                 in_stack_ffffffffffffff3c);
                            if (iVar2 != 0) {
                              return 1;
                            }
                            in_stack_ffffffffffffff40 = local_a4;
                            if (local_a4 == 1) {
                              rtol_00 = sqrt(100.0);
                            }
                            else if (local_a4 == 2) {
                              rtol_00 = -1.0;
                            }
                            else {
                              rtol_00 = 0.0;
                            }
                            IDASetLSNormFactor(rtol_00,local_18[0]);
                            iVar2 = check_retval(in_stack_ffffffffffffff48,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                  in_stack_ffffffffffffff40),
                                                 in_stack_ffffffffffffff3c);
                            if (iVar2 != 0) {
                              return 1;
                            }
                            PrintHeader(rtol_00,(sunrealtype)in_stack_ffffffffffffff48,
                                        in_stack_ffffffffffffff44);
                            printf("\n   Output Summary (umax = max-norm of solution) \n\n");
                            printf(
                                  "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n"
                                  );
                            printf(
                                  "----------------------------------------------------------------------\n"
                                  );
                            up_00 = in_stack_ffffffffffffff88;
                            for (iVar2 = 1; iVar2 < 0xc; iVar2 = iVar2 + 1) {
                              uVar3 = IDASolve(in_stack_ffffffffffffff88,local_18[0],local_80,uVar5,
                                               uVar6,1);
                              iVar4 = check_retval(in_stack_ffffffffffffff48,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                                    in_stack_ffffffffffffff40),
                                                   in_stack_ffffffffffffff3c);
                              if (iVar4 != 0) {
                                return 1;
                              }
                              PrintOutput(mem_00,(sunrealtype)CONCAT44(uVar3,iVar2),
                                          (N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                                          (int)((ulong)uVar8 >> 0x20));
                              in_stack_ffffffffffffff88 =
                                   (N_Vector)((double)in_stack_ffffffffffffff88 * 2.0);
                            }
                            IDAGetNumErrTestFails(local_18[0],&local_88);
                            check_retval(in_stack_ffffffffffffff48,
                                         (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                          in_stack_ffffffffffffff40),
                                         in_stack_ffffffffffffff3c);
                            IDAGetNumNonlinSolvConvFails(local_18[0],&local_90);
                            check_retval(in_stack_ffffffffffffff48,
                                         (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                          in_stack_ffffffffffffff40),
                                         in_stack_ffffffffffffff3c);
                            IDAGetNumLinConvFails(local_18[0],&local_98);
                            check_retval(in_stack_ffffffffffffff48,
                                         (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                          in_stack_ffffffffffffff40),
                                         in_stack_ffffffffffffff3c);
                            printf("\nError test failures            = %ld\n",local_88);
                            printf("Nonlinear convergence failures = %ld\n",local_90);
                            printf("Linear convergence failures    = %ld\n",local_98);
                            if (iVar1 < 2) {
                              printf(
                                    "\n======================================================================\n\n"
                                    );
                            }
                          }
                          IDAFree(local_18);
                          SUNLinSolFree(local_a0);
                          N_VDestroy(uVar5);
                          N_VDestroy(uVar6);
                          N_VDestroy(mem_00);
                          N_VDestroy(__ptr[3]);
                          free(__ptr);
                          SUNContext_Free(&stack0xffffffffffffff48);
                          local_4 = 0;
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, res;
  int retval, iout, linsolver;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  long int netf, ncfn, ncfl;
  SUNLinearSolver LS;
  int nrmfactor;      /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */
  SUNContext ctx;

  mem         = NULL;
  data        = NULL;
  uu          = NULL;
  up          = NULL;
  constraints = NULL;
  res         = NULL;
  LS          = NULL;
  nrmfactor   = 0;

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate N-vectors and the user data structure. */

  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }

  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }

  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  data     = (UserData)malloc(sizeof *data);
  data->pp = NULL;
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Assign parameters in the user data structure. */

  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / (data->dx * data->dx);
  data->pp    = N_VClone(uu);
  if (check_retval((void*)data->pp, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Set constraints to all 1's for nonnegative solution values. */

  N_VConst(ONE, constraints);

  /* Assign various parameters. */

  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, resHeat, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* START: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */
  for (linsolver = 0; linsolver < 3; ++linsolver)
  {
    if (linsolver != 0)
    {
      /* Re-initialize uu, up. */
      SetInitialProfile(data, uu, up, res);

      /* Re-initialize IDA */
      retval = IDAReInit(mem, t0, uu, up);
      if (check_retval(&retval, "IDAReInit", 1)) { return (1); }
    }

    /* Free previous linear solver and attach a new linear solver module */
    SUNLinSolFree(LS);

    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPGMR(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;

    /* (b) SPBCG */
    case (USE_SPBCG):

      /* Print header */
      printf(" -------");
      printf(" \n| SPBCGS |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPBCGS to specify the linear solver SPBCGS with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPBCGS(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPTFQMR to specify the linear solver SPTFQMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPTFQMR(uu, SUN_PREC_LEFT, 0, ctx);
      if (check_retval((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      /* Attach the linear solver */
      retval = IDASetLinearSolver(mem, LS, NULL);
      if (check_retval(&retval, "IDASetLinearSolver", 1)) { return 1; }

      break;
    }

    /* Specify preconditioner */
    retval = IDASetPreconditioner(mem, PsetupHeat, PsolveHeat);
    if (check_retval(&retval, "IDASetPreconditioner", 1)) { return (1); }

    /* Set the linear solver tolerance conversion factor */
    switch (nrmfactor)
    {
    case (1):
      /* use the square root of the vector length */
      nrmfac = SQRT((sunrealtype)NEQ);
      break;
    case (2):
      /* compute with dot product */
      nrmfac = -ONE;
      break;
    default:
      /* use the default */
      nrmfac = ZERO;
      break;
    }

    retval = IDASetLSNormFactor(mem, nrmfac);
    if (check_retval(&retval, "IDASetLSNormFactor", 1)) { return (1); }

    /* Print output heading. */
    PrintHeader(rtol, atol, linsolver);

    /* Print output table heading, and initial line of table. */

    printf("\n   Output Summary (umax = max-norm of solution) \n\n");
    printf("  time     umax       k  nst  nni  nje   nre   nreLS    h      npe "
           "nps\n");
    printf("-------------------------------------------------------------------"
           "---\n");

    /* Loop over output times, call IDASolve, and print results. */

    for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
    {
      retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
      if (check_retval(&retval, "IDASolve", 1)) { return (1); }
      PrintOutput(mem, tret, uu, linsolver);
    }

    /* Print remaining counters. */
    retval = IDAGetNumErrTestFails(mem, &netf);
    check_retval(&retval, "IDAGetNumErrTestFails", 1);

    retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
    check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

    retval = IDAGetNumLinConvFails(mem, &ncfl);
    check_retval(&retval, "IDAGetNumLinConvFails", 1);

    printf("\nError test failures            = %ld\n", netf);
    printf("Nonlinear convergence failures = %ld\n", ncfn);
    printf("Linear convergence failures    = %ld\n", ncfl);

    if (linsolver < 2)
    {
      printf("\n==============================================================="
             "=======\n\n");
    }

  } /* END: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */

  /* Free Memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);

  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(res);

  N_VDestroy(data->pp);
  free(data);

  SUNContext_Free(&ctx);

  return (0);
}